

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

void __thiscall MetaCommand::ListOptionsSimplified(MetaCommand *this)

{
  ostream *poVar1;
  pointer pFVar2;
  string *psVar3;
  char *pcVar4;
  pointer pOVar5;
  
  for (pOVar5 = (this->m_OptionVector).
                super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar5 != (this->m_OptionVector).
                super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                _M_impl.super__Vector_impl_data._M_finish; pOVar5 = pOVar5 + 1) {
    pcVar4 = "   [ ";
    if (pOVar5->required != false) {
      pcVar4 = "   ";
    }
    std::operator<<((ostream *)&std::cout,pcVar4);
    if ((pOVar5->tag)._M_string_length != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"-");
      poVar1 = std::operator<<(poVar1,(pOVar5->tag)._M_dataplus._M_p);
      std::operator<<(poVar1," ");
    }
    for (pFVar2 = (pOVar5->fields).
                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar2 != (pOVar5->fields).
                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pFVar2 = pFVar2 + 1) {
      if (pFVar2->type != FLAG) {
        pcVar4 = "<";
        if (pFVar2->required == false) {
          pcVar4 = "[";
        }
        std::operator<<((ostream *)&std::cout,pcVar4);
        std::operator<<((ostream *)&std::cout,(pFVar2->name)._M_dataplus._M_p);
        pcVar4 = "> ";
        if (pFVar2->required == false) {
          pcVar4 = "] ";
        }
        std::operator<<((ostream *)&std::cout,pcVar4);
      }
    }
    if (pOVar5->required == false) {
      std::operator<<((ostream *)&std::cout,"]");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if ((pOVar5->description)._M_string_length != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"      = ");
      std::operator<<(poVar1,(pOVar5->description)._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      for (psVar3 = (string *)
                    &((pOVar5->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start)->value;
          (pointer)(psVar3 + -0x40) !=
          (pOVar5->fields).
          super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
          super__Vector_impl_data._M_finish; psVar3 = psVar3 + 0xb0) {
        if ((*(long *)(psVar3 + -0x18) != 0) || (*(long *)(psVar3 + 8) != 0)) {
          poVar1 = std::operator<<((ostream *)&std::cout,"        With: ");
          std::operator<<(poVar1,*(char **)(psVar3 + -0x40));
          if (*(long *)(psVar3 + -0x18) != 0) {
            poVar1 = std::operator<<((ostream *)&std::cout," = ");
            std::operator<<(poVar1,*(char **)(psVar3 + -0x20));
          }
          if (*(long *)(psVar3 + 8) != 0) {
            poVar1 = std::operator<<((ostream *)&std::cout," (Default = ");
            poVar1 = std::operator<<(poVar1,psVar3);
            std::operator<<(poVar1,")");
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  if (this->m_HelpCallBack != (_func_void *)0x0) {
    (*this->m_HelpCallBack)();
    return;
  }
  return;
}

Assistant:

void MetaCommand::ListOptionsSimplified()
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if(!(*it).required)
      {
      METAIO_STREAM::cout << "   [ ";
      }
    else
      {
      METAIO_STREAM::cout << "   ";
      }
      if (!(*it).tag.empty()) {
        METAIO_STREAM::cout << "-" << (*it).tag.c_str() << " ";
      }
      auto itField = (*it).fields.begin();
      while (itField != (*it).fields.end()) {
        if ((*itField).type != FLAG) // only display the type if it's not a FLAG
        {
          if ((*itField).required) {
            METAIO_STREAM::cout << "<";
          }
        else
          {
          METAIO_STREAM::cout << "[";
          }

        METAIO_STREAM::cout << (*itField).name.c_str();

        if((*itField).required)
          {
          METAIO_STREAM::cout << "> ";
          }
        else
          {
          METAIO_STREAM::cout << "] ";
          }

        }
      ++itField;
      }

    if(!(*it).required)
      {
      METAIO_STREAM::cout << "]";
      }
    METAIO_STREAM::cout << METAIO_STREAM::endl;

    if (!(*it).description.empty()) {
      METAIO_STREAM::cout << "      = " << (*it).description.c_str();
      METAIO_STREAM::cout << METAIO_STREAM::endl;
      itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if (!(*itField).description.empty() || !(*itField).value.empty()) {
          METAIO_STREAM::cout << "        With: " << (*itField).name.c_str();
          if (!(*itField).description.empty()) {
            METAIO_STREAM::cout << " = " << (*itField).description.c_str();
          }
          if (!(*itField).value.empty()) {
            METAIO_STREAM::cout << " (Default = " << (*itField).value << ")";
          }
          METAIO_STREAM::cout << METAIO_STREAM::endl;
        }
        ++itField;
        }
    }

    METAIO_STREAM::cout << METAIO_STREAM::endl;
    ++it;
    }

    if (m_HelpCallBack != nullptr) {
      m_HelpCallBack();
    }
}